

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O2

int fixed_array_tests(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = test_json(&Alt,
                    "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 16.0], col:[\"Blue Red\", Green, Red],tests:[ {b:4}, {a:1, b:2}], \"bar\": [ 100, 0, 0, 0, 0, 0, 0, 0, 0, 1000], \"text\":\"hello\"}}"
                    ,
                    "{\"fixed_array\":{\"foo\":[1,2,0,0,0,0,0,0,0,0,0,0,0,0,0,16],\"bar\":[100,0,0,0,0,0,0,0,0,1000],\"col\":[\"Red Blue\",\"Green\",\"Red\"],\"tests\":[{\"a\":0,\"b\":4},{\"a\":1,\"b\":2}],\"text\":\"hello\"}}"
                    ,0,0,0,0x20c);
  uVar2 = test_json(&Alt,
                    "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 16.0, 99], \"bar\": [ 100, 0, 0, 0, 0, 0, 0, 0, 0, 1000, 99], \"text\":\"hello, world\"}}"
                    ,
                    "{\"fixed_array\":{\"foo\":[1,2,0,0,0,0,0,0,0,0,0,0,0,0,0,16],\"bar\":[100,0,0,0,0,0,0,0,0,1000],\"col\":[0,0,0],\"tests\":[{\"a\":0,\"b\":0},{\"a\":0,\"b\":0}],\"text\":\"hello\"}}"
                    ,0,8,0,0x225);
  uVar3 = test_json(&Alt,
                    "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0 ], \"bar\": [ 100 ], \"text\": \"K\\x00A\\x00\" }}"
                    ,
                    "{\"fixed_array\":{\"foo\":[1,2,0,0,0,0,0,0,0,0,0,0,0,0,0,0],\"bar\":[100,0,0,0,0,0,0,0,0,0],\"col\":[0,0,0],\"tests\":[{\"a\":0,\"b\":0},{\"a\":0,\"b\":0}],\"text\":\"K\\u0000A\"}}"
                    ,0,0,0,0x22e);
  uVar4 = test_json(&Alt,"{ \"fixed_array\": { \"foo\": [ 1.0, 2.0 ] }}",(char *)0x0,0x21,0x10,0,
                    0x232);
  uVar5 = test_json(&Alt,"{ \"fixed_array\": { \"text\": \"K\\x00A\\x00\" }}",(char *)0x0,0x21,0x10,
                    0,0x236);
  uVar6 = test_json(&Alt,
                    "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 16.0, 99], \"bar\": [ 100, 0, 0, 0, 0, 0, 0, 0, 0, 1000, 99] }}"
                    ,(char *)0x0,0x22,0,0,0x23c);
  return uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int fixed_array_tests(void)
{
    BEGIN_TEST(Alt);
    /* Fixed array */

#if UQ
    TEST(   "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0, 0, 0, 0, 0, 0,"
            " 0, 0, 0, 0, 0, 0, 0, 0, 16.0], col:[\"Blue Red\", Green, Red],"
            "tests:[ {b:4}, {a:1, b:2}],"
            " \"bar\": [ 100, 0, 0, 0, 0, 0, 0, 0, 0, 1000],"
            " \"text\":\"hello\"}}",
            "{\"fixed_array\":{\"foo\":[1,2,0,0,0,0,0,"
            "0,0,0,0,0,0,0,0,16],"
            "\"bar\":[100,0,0,0,0,0,0,0,0,1000],"
            "\"col\":[\"Red Blue\",\"Green\",\"Red\"],"
            "\"tests\":[{\"a\":0,\"b\":4},{\"a\":1,\"b\":2}],"
            "\"text\":\"hello\"}}");
#else
    TEST(   "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0, 0, 0, 0, 0, 0,"
            " 0, 0, 0, 0, 0, 0, 0, 0, 16.0], \"col\":[\"Blue Red\", \"Green\", \"Red\"],"
            "\"tests\":[ {\"b\":4}, {\"a\":1, \"b\":2}],"
            " \"bar\": [ 100, 0, 0, 0, 0, 0, 0, 0, 0, 1000],"
            " \"text\":\"hello\"}}",
            "{\"fixed_array\":{\"foo\":[1,2,0,0,0,0,0,"
            "0,0,0,0,0,0,0,0,16],"
            "\"bar\":[100,0,0,0,0,0,0,0,0,1000],"
            "\"col\":[\"Red Blue\",\"Green\",\"Red\"],"
            "\"tests\":[{\"a\":0,\"b\":4},{\"a\":1,\"b\":2}],"
            "\"text\":\"hello\"}}");
#endif

    TEST_FLAGS(flatcc_json_parser_f_skip_array_overflow, 0,
            "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0, 0, 0, 0, 0, 0,"
            " 0, 0, 0, 0, 0, 0, 0, 0, 16.0, 99],"
            " \"bar\": [ 100, 0, 0, 0, 0, 0, 0, 0, 0, 1000, 99],"
            " \"text\":\"hello, world\"}}",
            "{\"fixed_array\":{\"foo\":[1,2,0,0,0,0,0,"
            "0,0,0,0,0,0,0,0,16],"
            "\"bar\":[100,0,0,0,0,0,0,0,0,1000],"
            "\"col\":[0,0,0],"
            "\"tests\":[{\"a\":0,\"b\":0},{\"a\":0,\"b\":0}],"
            "\"text\":\"hello\"}}");

    TEST(   "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0 ],"
            " \"bar\": [ 100 ], \"text\": \"K\\x00A\\x00\" }}",
            "{\"fixed_array\":{\"foo\":[1,2,0,0,0,0,0,"
            "0,0,0,0,0,0,0,0,0],"
            "\"bar\":[100,0,0,0,0,0,0,0,0,0],"
            "\"col\":[0,0,0],"
            "\"tests\":[{\"a\":0,\"b\":0},{\"a\":0,\"b\":0}],"
            "\"text\":\"K\\u0000A\"}}");

    TEST_ERROR_FLAGS(flatcc_json_parser_f_reject_array_underflow, 0,
            "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0 ] }}",
            flatcc_json_parser_error_array_underflow);

    TEST_ERROR_FLAGS(flatcc_json_parser_f_reject_array_underflow, 0,
            "{ \"fixed_array\": { \"text\": \"K\\x00A\\x00\" }}",
            flatcc_json_parser_error_array_underflow);

    TEST_ERROR(
            "{ \"fixed_array\": { \"foo\": [ 1.0, 2.0, 0, 0, 0, 0, 0,"
            " 0, 0, 0, 0, 0, 0, 0, 0, 16.0, 99],"
            " \"bar\": [ 100, 0, 0, 0, 0, 0, 0, 0, 0, 1000, 99] }}",
            flatcc_json_parser_error_array_overflow);

    END_TEST();
}